

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::InvisibleButton(char *str_id,ImVec2 *size_arg)

{
  ImGuiWindow *this;
  bool bVar1;
  bool bVar2;
  ImGuiID id;
  bool held;
  bool hovered;
  ImRect bb;
  ImVec2 size;
  bool local_3a;
  bool local_39;
  ImRect local_38;
  ImVec2 local_28;
  
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    if (((size_arg->x == 0.0) && (!NAN(size_arg->x))) ||
       ((size_arg->y == 0.0 && (!NAN(size_arg->y))))) {
      __assert_fail("size_arg.x != 0.0f && size_arg.y != 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui_widgets.cpp"
                    ,0x2a3,"bool ImGui::InvisibleButton(const char *, const ImVec2 &)");
    }
    bVar2 = false;
    id = ImGuiWindow::GetID(this,str_id,(char *)0x0);
    local_28 = CalcItemSize(*size_arg,0.0,0.0);
    local_38.Max.x = (this->DC).CursorPos.x + local_28.x;
    local_38.Max.y = (this->DC).CursorPos.y + local_28.y;
    local_38.Min = (this->DC).CursorPos;
    ItemSize(&local_28,-1.0);
    bVar1 = ItemAdd(&local_38,id,(ImRect *)0x0);
    if (bVar1) {
      bVar2 = ButtonBehavior(&local_38,id,&local_39,&local_3a,0);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* const items[], int items_count, int height_in_items)
{
    const bool value_changed = Combo(label, current_item, Items_ArrayGetter, (void*)items, items_count, height_in_items);
    return value_changed;
}